

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<kj::Array<unsigned_char>_> *
kj::parse::
Many_<kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>,_true>
::Impl<capnp::compiler::Lexer::ParserInput,_unsigned_char>::apply
          (Maybe<kj::Array<unsigned_char>_> *__return_storage_ptr__,
          Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
          *subParser,ParserInput *input)

{
  char *pcVar1;
  char cVar2;
  uchar uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Maybe<kj::Array<unsigned_char>_> *pMVar6;
  char *pcVar7;
  size_t newSize;
  ParserInput subInput;
  undefined1 local_8a [42];
  Maybe<kj::Array<unsigned_char>_> *local_60;
  ParserInput *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_8a._2_8_ = (uchar *)0x0;
  local_8a._10_8_ = (uchar *)0x0;
  local_8a._18_8_ = (uchar *)0x0;
  local_60 = __return_storage_ptr__;
  do {
    pcVar7 = (input->super_IteratorInput<char,_const_char_*>).pos;
    pcVar1 = (input->super_IteratorInput<char,_const_char_*>).end;
    if (pcVar7 == pcVar1) break;
    local_38 = input->begin;
    local_58 = input;
    local_50 = pcVar7;
    local_48 = pcVar1;
    local_40 = pcVar7;
    Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
    ::operator()<capnp::compiler::Lexer::ParserInput>
              ((Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>
                *)local_8a,(ParserInput *)subParser);
    uVar3 = local_8a[1];
    cVar2 = local_8a[0];
    if (local_8a[0] == '\x01') {
      (local_58->super_IteratorInput<char,_const_char_*>).pos = local_50;
      if (local_8a._10_8_ == local_8a._18_8_) {
        newSize = (local_8a._10_8_ - local_8a._2_8_) * 2;
        if (local_8a._10_8_ == local_8a._2_8_) {
          newSize = 4;
        }
        Vector<unsigned_char>::setCapacity((Vector<unsigned_char> *)(local_8a + 2),newSize);
      }
      *(uchar *)local_8a._10_8_ = uVar3;
      local_8a._10_8_ = local_8a._10_8_ + 1;
    }
    if (local_58 != (ParserInput *)0x0) {
      pcVar7 = local_40;
      if (local_40 < local_50) {
        pcVar7 = local_50;
      }
      pcVar1 = (local_58->super_IteratorInput<char,_const_char_*>).best;
      if (pcVar7 <= pcVar1) {
        pcVar7 = pcVar1;
      }
      (local_58->super_IteratorInput<char,_const_char_*>).best = pcVar7;
    }
  } while (cVar2 != '\0');
  pMVar6 = local_60;
  uVar5 = local_8a._18_8_;
  uVar4 = local_8a._2_8_;
  if (local_8a._10_8_ - local_8a._2_8_ == 0) {
    (local_60->ptr).isSet = false;
    if ((uchar *)local_8a._2_8_ != (uchar *)0x0) {
      local_8a._2_8_ = 0;
      local_8a._10_8_ = 0;
      local_8a._18_8_ = 0;
      (***(_func_int ***)local_8a._26_8_)(local_8a._26_8_,uVar4,1,0,uVar5 - uVar4,0);
    }
  }
  else {
    if (local_8a._10_8_ != local_8a._18_8_) {
      Vector<unsigned_char>::setCapacity
                ((Vector<unsigned_char> *)(local_8a + 2),local_8a._10_8_ - local_8a._2_8_);
    }
    (pMVar6->ptr).isSet = true;
    (pMVar6->ptr).field_1.value.ptr = (uchar *)local_8a._2_8_;
    (pMVar6->ptr).field_1.value.size_ = local_8a._10_8_ - local_8a._2_8_;
    (pMVar6->ptr).field_1.value.disposer = (ArrayDisposer *)local_8a._26_8_;
  }
  return pMVar6;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }